

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O1

cl_int xmrig::OclLib::release(cl_mem mem_obj)

{
  cl_int ret;
  char *pcVar1;
  
  if (mem_obj == (cl_mem)0x0) {
    ret = 0;
  }
  else {
    ret = (*pReleaseMemObject)(mem_obj);
    if (ret != 0) {
      pcVar1 = OclError::toString(ret);
      Log::print(ERR,
                 "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
                 ,pcVar1,"clReleaseMemObject");
    }
  }
  return ret;
}

Assistant:

cl_int xmrig::OclLib::release(cl_mem mem_obj) noexcept
{
    assert(pReleaseMemObject != nullptr);

    if (mem_obj == nullptr) {
        return CL_SUCCESS;
    }

    LOG_REFS("%p %u ~mem %zub", mem_obj, getUint(mem_obj, CL_MEM_REFERENCE_COUNT), getUlong(mem_obj, CL_MEM_SIZE));

    const cl_int ret = pReleaseMemObject(mem_obj);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseMemObject);
    }

    return ret;
}